

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONState.cxx
# Opt level: O0

Location __thiscall cmJSONState::LocateInDocument(cmJSONState *this,ptrdiff_t offset)

{
  Location LVar1;
  char *pcVar2;
  char *last;
  char *beginDoc;
  int col;
  int line;
  ptrdiff_t offset_local;
  cmJSONState *this_local;
  
  beginDoc._4_4_ = 1;
  beginDoc._0_4_ = 1;
  last = (char *)std::__cxx11::string::data();
  pcVar2 = last + offset;
  do {
    if (last == pcVar2) {
      LVar1.column = (int)beginDoc;
      LVar1.line = beginDoc._4_4_;
      return LVar1;
    }
    if (*last == '\n') {
LAB_00431d5f:
      beginDoc._0_4_ = 1;
      beginDoc._4_4_ = beginDoc._4_4_ + 1;
    }
    else if (*last == '\r') {
      if ((last + 1 == pcVar2) || (last[1] != '\n')) goto LAB_00431d5f;
    }
    else {
      beginDoc._0_4_ = (int)beginDoc + 1;
    }
    last = last + 1;
  } while( true );
}

Assistant:

cmJSONState::Location cmJSONState::LocateInDocument(ptrdiff_t offset)
{
  int line = 1;
  int col = 1;
  const char* beginDoc = doc.data();
  const char* last = beginDoc + offset;
  for (; beginDoc != last; ++beginDoc) {
    switch (*beginDoc) {
      case '\r':
        if (beginDoc + 1 != last && beginDoc[1] == '\n') {
          continue; // consume CRLF as a single token.
        }
        CM_FALLTHROUGH; // CR without a following LF is same as LF
      case '\n':
        col = 1;
        ++line;
        break;
      default:
        ++col;
        break;
    }
  }
  return { line, col };
}